

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

ostream * operator<<(ostream *out,skiplist<DictKey,_std::less<DictKey>_> *sl)

{
  pointer ppSVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  SLNode<DictKey> *pSVar4;
  int i;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_84;
  pointer local_80;
  _Rb_tree<DictKey,_std::pair<const_DictKey,_int>,_std::_Select1st<std::pair<const_DictKey,_int>_>,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
  local_68;
  
  ppSVar1 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 !=
      (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl._0_8_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    pSVar4 = *ppSVar1;
    local_84 = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pSVar4 = pSVar4->next, pSVar4 != (SLNode<DictKey> *)0x0) {
      pmVar2 = std::
               map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
               ::operator[]((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                             *)&local_68,&pSVar4->val);
      *pmVar2 = local_84;
      local_84 = local_84 + 1;
    }
    ppSVar1 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_80 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    while (local_80 != ppSVar1) {
      std::operator<<(out,"S");
      pSVar4 = local_80[-1];
      local_80 = local_80 + -1;
      iVar5 = -1;
      while( true ) {
        pSVar4 = pSVar4->next;
        if (pSVar4 == (SLNode<DictKey> *)0x0) break;
        pmVar2 = std::
                 map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                 ::operator[]((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                               *)&local_68,&pSVar4->val);
        iVar7 = *pmVar2;
        for (iVar6 = 1; iVar6 < iVar7 - iVar5; iVar6 = iVar6 + 1) {
          std::operator<<(out,"----");
        }
        poVar3 = std::operator<<(out,"-");
        poVar3 = std::operator<<(poVar3,0x2d);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        operator<<(poVar3,&pSVar4->val);
        iVar5 = iVar7;
      }
      for (iVar7 = 1; iVar7 < local_84 - iVar5; iVar7 = iVar7 + 1) {
        std::operator<<(out,"----");
      }
      std::operator<<(out,"-E");
      std::endl<char,std::char_traits<char>>(out);
    }
    std::
    _Rb_tree<DictKey,_std::pair<const_DictKey,_int>,_std::_Select1st<std::pair<const_DictKey,_int>_>,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
    ::~_Rb_tree(&local_68);
    return out;
  }
  poVar3 = std::operator<<(out,"EMPTY SKIPLIST");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  return poVar3;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const skiplist<T, X>& sl) {
    if (sl.key.empty()) {
        return out << "EMPTY SKIPLIST" << std::endl;
    }

    // store mapping of node->index in a map
    std::map<T, int> index_store{};
    auto bottom_it = (*(sl.key.begin()))->next;
    int cur_index = 0;
    while (bottom_it) {
        index_store[bottom_it->val] = cur_index;
        cur_index++;
        bottom_it = bottom_it->next;
    }

    auto level = sl.key.rbegin();
    auto end = sl.key.rend();
    while(level != end) {
        // S denotes start of level, could be something different
        out << "S";

        // to store previous element's index
        // and current element's index
        int index = -1, next_index;
        // skip the first element - it is always 0
        auto it = (*level)->next;
        // iterate through the list at this level
        while (it) {
            next_index = index_store[it->val];

            // filler to align it correctly
            // when elements in between don't exist at this level
            for (int i = 1; i < next_index - index; ++i) {
                out << "----";
            }

            // width of printed element is hardcoded to 3 for now
            // the padding is filled with ""-"
            out << "-" << std::setfill('-') << std::setw(3) << it->val;
            it = it->next;

            index = next_index;
        }
        next_index = cur_index;

        for (int i = 1; i < next_index - index; ++i) {
            out << "----";
        }

        out << "-E";

        out << std::endl;

        level++;
    }

    return out;
}